

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O0

bool __thiscall AgenPeeps::AgenDependentInstrs(AgenPeeps *this,Instr *instr1,Instr *instr2)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *this_00;
  RegOpnd *pRVar3;
  RegOpnd *pRVar4;
  bool local_7e;
  bool local_7c;
  bool local_7a;
  IndirOpnd *local_78;
  IndirOpnd *local_70;
  IndirOpnd *local_68;
  RegOpnd *index;
  RegOpnd *base;
  RegOpnd *regOpnd;
  IndirOpnd *dst;
  IndirOpnd *src2;
  IndirOpnd *src1;
  Instr *instr2_local;
  Instr *instr1_local;
  AgenPeeps *this_local;
  
  bVar1 = LowererMD::IsAssign(instr1);
  if ((!bVar1) || (bVar1 = DependentInstrs(this,instr1,instr2), !bVar1)) {
    return false;
  }
  pOVar2 = IR::Instr::GetDst(instr1);
  bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
  if (!bVar1) {
    return false;
  }
  pOVar2 = IR::Instr::GetSrc1(instr2);
  if (pOVar2 == (Opnd *)0x0) {
LAB_0087d743:
    local_68 = (IndirOpnd *)0x0;
  }
  else {
    pOVar2 = IR::Instr::GetSrc1(instr2);
    bVar1 = IR::Opnd::IsIndirOpnd(pOVar2);
    if (!bVar1) goto LAB_0087d743;
    pOVar2 = IR::Instr::GetSrc1(instr2);
    local_68 = IR::Opnd::AsIndirOpnd(pOVar2);
  }
  pOVar2 = IR::Instr::GetSrc2(instr2);
  if (pOVar2 == (Opnd *)0x0) {
LAB_0087d790:
    local_70 = (IndirOpnd *)0x0;
  }
  else {
    pOVar2 = IR::Instr::GetSrc2(instr2);
    bVar1 = IR::Opnd::IsIndirOpnd(pOVar2);
    if (!bVar1) goto LAB_0087d790;
    pOVar2 = IR::Instr::GetSrc2(instr2);
    local_70 = IR::Opnd::AsIndirOpnd(pOVar2);
  }
  pOVar2 = IR::Instr::GetDst(instr2);
  if (pOVar2 != (Opnd *)0x0) {
    pOVar2 = IR::Instr::GetDst(instr2);
    bVar1 = IR::Opnd::IsIndirOpnd(pOVar2);
    if (bVar1) {
      pOVar2 = IR::Instr::GetDst(instr2);
      local_78 = IR::Opnd::AsIndirOpnd(pOVar2);
      goto LAB_0087d7e5;
    }
  }
  local_78 = (IndirOpnd *)0x0;
LAB_0087d7e5:
  pOVar2 = IR::Instr::GetDst(instr1);
  this_00 = IR::Opnd::AsRegOpnd(pOVar2);
  if (local_68 != (IndirOpnd *)0x0) {
    pRVar3 = IR::IndirOpnd::GetBaseOpnd(local_68);
    pRVar4 = IR::IndirOpnd::GetIndexOpnd(local_68);
    if ((pRVar3 != (RegOpnd *)0x0) &&
       (bVar1 = IR::RegOpnd::IsSameRegUntyped(this_00,&pRVar3->super_Opnd), bVar1)) {
      return true;
    }
    local_7a = false;
    if (pRVar4 != (RegOpnd *)0x0) {
      local_7a = IR::RegOpnd::IsSameRegUntyped(this_00,&pRVar4->super_Opnd);
    }
    return local_7a;
  }
  if (local_70 != (IndirOpnd *)0x0) {
    pRVar3 = IR::IndirOpnd::GetBaseOpnd(local_70);
    pRVar4 = IR::IndirOpnd::GetIndexOpnd(local_70);
    if ((pRVar3 != (RegOpnd *)0x0) &&
       (bVar1 = IR::RegOpnd::IsSameRegUntyped(this_00,&pRVar3->super_Opnd), bVar1)) {
      return true;
    }
    local_7c = false;
    if (pRVar4 != (RegOpnd *)0x0) {
      local_7c = IR::RegOpnd::IsSameRegUntyped(this_00,&pRVar4->super_Opnd);
    }
    return local_7c;
  }
  if (local_78 == (IndirOpnd *)0x0) {
    return false;
  }
  pRVar3 = IR::IndirOpnd::GetBaseOpnd(local_78);
  pRVar4 = IR::IndirOpnd::GetIndexOpnd(local_78);
  if ((pRVar3 != (RegOpnd *)0x0) &&
     (bVar1 = IR::RegOpnd::IsSameRegUntyped(this_00,&pRVar3->super_Opnd), bVar1)) {
    return true;
  }
  local_7e = false;
  if (pRVar4 != (RegOpnd *)0x0) {
    local_7e = IR::RegOpnd::IsSameRegUntyped(this_00,&pRVar4->super_Opnd);
  }
  return local_7e;
}

Assistant:

bool AgenPeeps::AgenDependentInstrs(IR::Instr *instr1, IR::Instr *instr2)
{
    // We only deal with assign instructions for now.
    if (!LowererMD::IsAssign(instr1) || !DependentInstrs(instr1, instr2))
        return false;

    if (instr1->GetDst()->IsRegOpnd())
    {
        IR::IndirOpnd *src1 = (instr2->GetSrc1() && instr2->GetSrc1()->IsIndirOpnd()) ? instr2->GetSrc1()->AsIndirOpnd() : nullptr;
        IR::IndirOpnd *src2 = (instr2->GetSrc2() && instr2->GetSrc2()->IsIndirOpnd()) ? instr2->GetSrc2()->AsIndirOpnd() : nullptr;
        IR::IndirOpnd *dst  = (instr2->GetDst()  && instr2->GetDst()->IsIndirOpnd())  ? instr2->GetDst()->AsIndirOpnd() : nullptr;
        IR::RegOpnd   *regOpnd = instr1->GetDst()->AsRegOpnd();

        IR::RegOpnd *base, *index;
        if (src1)
        {
            base = src1->GetBaseOpnd();
            index = src1->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }

        if (src2)
        {
            base = src2->GetBaseOpnd();
            index = src2->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }

        if (dst)
        {
            base = dst->GetBaseOpnd();
            index = dst->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }
    }
    return false;
}